

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O0

EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
* __thiscall
EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
::Solve(EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
        *this,Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
              *polynome)

{
  bool bVar1;
  ulong uVar2;
  EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_RDX;
  long *in_RSI;
  EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
  *in_RDI;
  EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
  *this_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  this_00 = in_RDI;
  uVar2 = (**(code **)(*in_RSI + 0x10))(in_RSI,in_RDX);
  if ((uVar2 & 1) == 0) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                        *)0x11779e);
    if (bVar1) {
      std::
      unique_ptr<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
      ::operator->((unique_ptr<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                    *)0x1177b2);
      Solve(in_RDX,(Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    else {
      std::
      variant<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>,SpecificSolution>
      ::variant<SpecificSolution,void,void,SpecificSolution,void>
                (this_00,(SpecificSolution *)in_RDI);
    }
  }
  else {
    (**(code **)(*in_RSI + 0x18))(in_RDI,in_RSI,in_RDX);
  }
  return this_00;
}

Assistant:

EquationSolution<ValueType> Solve(const Polynome<ValueType> &polynome) const {
        //each solver can either solve the equation or give it to the next solver in a chain
        if (CanSolve(polynome)) {
            return SolveImpl(polynome);
        }
        if (nextSolver) {
            return nextSolver->Solve(polynome);
        } else {
            //todo consider throwing an exception here instead of can't solve solution
            return SpecificSolution::kCannotSolve;
        }
    }